

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.cpp
# Opt level: O1

void xs::Message::parseHeader(deUint8 *data,size_t dataSize,MessageType *type,size_t *size)

{
  uint uVar1;
  MessageType MVar2;
  Error *this;
  MessageParser parser;
  MessageParser local_30;
  
  if (7 < dataSize) {
    local_30.m_pos = 0;
    local_30.m_data = data;
    local_30.m_size = dataSize;
    uVar1 = MessageParser::get<int>(&local_30);
    *size = (ulong)uVar1;
    MVar2 = MessageParser::get<int>(&local_30);
    *type = MVar2;
    return;
  }
  this = (Error *)__cxa_allocate_exception(0x10);
  Error::Error(this,"Incomplete header","dataSize >= MESSAGE_HEADER_SIZE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/execserver/xsProtocol.cpp"
               ,0x8f);
  __cxa_throw(this,&Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Message::parseHeader (const deUint8* data, size_t dataSize, MessageType& type, size_t& size)
{
	XS_CHECK_MSG(dataSize >= MESSAGE_HEADER_SIZE, "Incomplete header");
	MessageParser parser(data, dataSize);
	size	= (size_t)(MessageType)parser.get<int>();
	type	= (MessageType)parser.get<int>();
}